

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::PrintTestPartResultToString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TestPartResult *test_part_result)

{
  ostream *poVar1;
  size_t sVar2;
  int in_ECX;
  internal *this_00;
  char *pcVar3;
  string local_58;
  Message local_38;
  
  Message::Message(&local_38);
  this_00 = *(internal **)(this + 0x10);
  if (this_00 != (internal *)0x0) {
    this_00 = *(internal **)(this + 8);
  }
  FormatFileLocation_abi_cxx11_(&local_58,this_00,(char *)(ulong)*(uint *)(this + 0x28),in_ECX);
  poVar1 = (ostream *)((long)local_38.ss_.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((ulong)*(uint *)this < 3) {
    pcVar3 = &DAT_0016b3c0 + *(int *)(&DAT_0016b3c0 + (ulong)*(uint *)this * 4);
  }
  else {
    pcVar3 = "Unknown result type";
  }
  sVar2 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,sVar2);
  pcVar3 = *(char **)(this + 0x50);
  if (pcVar3 == (char *)0x0) {
    sVar2 = 6;
    pcVar3 = "(null)";
  }
  else {
    sVar2 = strlen(pcVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,sVar2);
  StringStreamToString(__return_storage_ptr__,(stringstream *)local_38.ss_.ptr_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38.ss_.ptr_ + 8))(local_38.ss_.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}